

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::UninterpretedOption::MergeFrom
          (UninterpretedOption *this,UninterpretedOption *from)

{
  double dVar1;
  int iVar2;
  UninterpretedOption_NamePart *from_00;
  void **ppvVar3;
  uint64 uVar4;
  int64 iVar5;
  uint uVar6;
  LogMessage *other;
  UninterpretedOption_NamePart *this_00;
  string *psVar7;
  int iVar8;
  long lVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1d1f);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->name_).super_RepeatedPtrFieldBase,
             (from->name_).super_RepeatedPtrFieldBase.current_size_ +
             (this->name_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->name_).super_RepeatedPtrFieldBase.current_size_) {
    lVar9 = 0;
    do {
      from_00 = (UninterpretedOption_NamePart *)
                (from->name_).super_RepeatedPtrFieldBase.elements_[lVar9];
      iVar2 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (this->name_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar3 = (this->name_).super_RepeatedPtrFieldBase.elements_;
        (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        this_00 = (UninterpretedOption_NamePart *)ppvVar3[iVar2];
      }
      else {
        if (iVar8 == (this->name_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->name_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (this->name_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->name_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>::New
                            ();
        ppvVar3 = (this->name_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
        (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar3[iVar2] = this_00;
      }
      UninterpretedOption_NamePart::MergeFrom(this_00,from_00);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (from->name_).super_RepeatedPtrFieldBase.current_size_);
  }
  uVar6 = from->_has_bits_[0];
  if ((uVar6 & 0x1fe) != 0) {
    if ((uVar6 & 2) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      psVar7 = this->identifier_value_;
      if (psVar7 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        this->identifier_value_ = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)psVar7);
      uVar6 = from->_has_bits_[0];
    }
    if ((uVar6 & 4) != 0) {
      uVar4 = from->positive_int_value_;
      this->_has_bits_[0] = this->_has_bits_[0] | 4;
      this->positive_int_value_ = uVar4;
      uVar6 = from->_has_bits_[0];
    }
    if ((uVar6 & 8) != 0) {
      iVar5 = from->negative_int_value_;
      this->_has_bits_[0] = this->_has_bits_[0] | 8;
      this->negative_int_value_ = iVar5;
      uVar6 = from->_has_bits_[0];
    }
    if ((uVar6 & 0x10) != 0) {
      dVar1 = from->double_value_;
      this->_has_bits_[0] = this->_has_bits_[0] | 0x10;
      this->double_value_ = dVar1;
      uVar6 = from->_has_bits_[0];
    }
    if ((uVar6 & 0x20) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x20;
      psVar7 = this->string_value_;
      if (psVar7 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        this->string_value_ = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)psVar7);
      uVar6 = from->_has_bits_[0];
    }
    if ((uVar6 & 0x40) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 0x40;
      psVar7 = this->aggregate_value_;
      if (psVar7 == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        this->aggregate_value_ = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)psVar7);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void UninterpretedOption::MergeFrom(const UninterpretedOption& from) {
  GOOGLE_CHECK_NE(&from, this);
  name_.MergeFrom(from.name_);
  if (from._has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    if (from.has_identifier_value()) {
      set_identifier_value(from.identifier_value());
    }
    if (from.has_positive_int_value()) {
      set_positive_int_value(from.positive_int_value());
    }
    if (from.has_negative_int_value()) {
      set_negative_int_value(from.negative_int_value());
    }
    if (from.has_double_value()) {
      set_double_value(from.double_value());
    }
    if (from.has_string_value()) {
      set_string_value(from.string_value());
    }
    if (from.has_aggregate_value()) {
      set_aggregate_value(from.aggregate_value());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}